

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

bool Assimp::isNanOrInf(char *in)

{
  int iVar1;
  char *in_local;
  
  if (((*in == 'N') || (*in == 'n')) && (iVar1 = ASSIMP_strincmp(in,"nan",3), iVar1 == 0)) {
    return true;
  }
  if (((*in == 'I') || (*in == 'i')) && (iVar1 = ASSIMP_strincmp(in,"inf",3), iVar1 == 0)) {
    return true;
  }
  return false;
}

Assistant:

static bool isNanOrInf(const char * in) {
    // Look for "nan" or "inf", case insensitive
    if ((in[0] == 'N' || in[0] == 'n') && ASSIMP_strincmp(in, "nan", 3) == 0) {
        return true;
    }
    else if ((in[0] == 'I' || in[0] == 'i') && ASSIMP_strincmp(in, "inf", 3) == 0) {
        return true;
    }
    return false;
}